

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_2
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *this_00;
  double *in_RCX;
  double dVar4;
  VectorXd b3;
  VectorXd Rho_temp;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  int i;
  MatrixXd L_6x3;
  EigenBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffca8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffcb0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffcb8;
  SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>_>
  *in_stack_fffffffffffffcc0;
  int *in_stack_fffffffffffffcc8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffcd0;
  double local_328;
  undefined8 in_stack_fffffffffffffce0;
  MatrixType *in_stack_fffffffffffffce8;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffffcf0;
  int local_44;
  
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
  for (local_44 = 0; local_44 < 6; local_44 = local_44 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x90f53c);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x90f574);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x90f5ad);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x90f5e6);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x90f61f);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x90f64f);
    *pSVar2 = dVar4;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             (uint)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcb0,
             (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffca8);
  Eigen::SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,-1,-1,0,-1,-1>,2>>>::
  solve<Eigen::Matrix<double,_1,1,0,_1,1>>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>,2>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8)
  ;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
  if (0.0 <= *pSVar3) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    dVar4 = sqrt(*pSVar3);
    *in_RCX = dVar4;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    if (*pSVar3 <= 0.0) {
      dVar4 = 0.0;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
      dVar4 = sqrt(*pSVar3);
    }
    in_RCX[1] = dVar4;
  }
  else {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    dVar4 = sqrt(-*pSVar3);
    *in_RCX = dVar4;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
    if (0.0 <= *pSVar3) {
      local_328 = 0.0;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
      local_328 = sqrt(-*pSVar3);
    }
    in_RCX[1] = local_328;
  }
  this_00 = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      (in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8);
  if ((double)(this_00->
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>).
              m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data < 0.0) {
    *in_RCX = -*in_RCX;
  }
  in_RCX[2] = 0.0;
  in_RCX[3] = 0.0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x90f99f);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x90f9ac);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x90f9c6);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_2(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x3(6,3);

  for(int i = 0; i < 6; i++)
  {
    L_6x3(i,0) = L_6x10(i,0);
    L_6x3(i,1) = L_6x10(i,1);
    L_6x3(i,2) = L_6x10(i,2);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x3,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b3 = SVD.solve(Rho_temp);

  if (b3[0] < 0)
  {
    betas[0] = sqrt(-b3[0]);
    betas[1] = (b3[2] < 0) ? sqrt(-b3[2]) : 0.0;
  }
  else
  {
    betas[0] = sqrt(b3[0]);
    betas[1] = (b3[2] > 0) ? sqrt(b3[2]) : 0.0;
  }

  if (b3[1] < 0) betas[0] = -betas[0];

  betas[2] = 0.0;
  betas[3] = 0.0;
}